

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

bool baryonyx::itm::
     affect<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
               (solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                *slv,bit_array *x,row_value *it,int k,int selected,int r_size,float kappa,
               float delta)

{
  float lhs;
  float fVar1;
  bool bVar2;
  type pfVar3;
  type prVar4;
  row_value *prVar5;
  float fVar6;
  undefined1 auVar7 [16];
  row_value *var_3;
  row_value *var_2;
  int i_2;
  row_value *var_1;
  int i_1;
  row_value *var;
  int i;
  float d;
  float old_pi;
  float middle;
  float two;
  float one;
  float delta_local;
  float kappa_local;
  int r_size_local;
  int selected_local;
  int k_local;
  row_value *it_local;
  bit_array *x_local;
  solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  *slv_local;
  
  pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&slv->pi,(long)k);
  lhs = *pfVar3;
  if (selected < 0) {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&slv->R,0);
    auVar7._0_4_ = prVar4->value / 2.0;
    auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)(kappa / (1.0 - kappa))),ZEXT416((uint)delta));
    for (var._4_4_ = 0; var._4_4_ != r_size; var._4_4_ = var._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var._4_4_);
      prVar5 = it + prVar4->id;
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var._4_4_);
      bVar2 = solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
              ::rc_data::is_negative_factor(prVar4);
      if (bVar2) {
        bit_array_impl::set(&x->super_bit_array_impl,prVar5->column);
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *pfVar3 = auVar7._0_4_ + *pfVar3;
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,prVar5->column);
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *pfVar3 = *pfVar3 - auVar7._0_4_;
      }
    }
  }
  else if (selected + 1 < r_size) {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)selected);
    fVar6 = prVar4->value;
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)(selected + 1));
    fVar1 = prVar4->value;
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&slv->pi,(long)k);
    *pfVar3 = (fVar6 + fVar1) / 2.0 + *pfVar3;
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)(selected + 1));
    fVar6 = prVar4->value;
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)selected);
    auVar7 = vfmadd213ss_fma(ZEXT416((uint)(fVar6 - prVar4->value)),
                             ZEXT416((uint)(kappa / (1.0 - kappa))),ZEXT416((uint)delta));
    fVar6 = auVar7._0_4_;
    for (var_2._4_4_ = 0; var_2._4_4_ <= selected; var_2._4_4_ = var_2._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_2._4_4_);
      prVar5 = it + prVar4->id;
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_2._4_4_);
      bVar2 = solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
              ::rc_data::is_negative_factor(prVar4);
      if (bVar2) {
        bit_array_impl::unset(&x->super_bit_array_impl,prVar5->column);
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *pfVar3 = *pfVar3 - fVar6;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,prVar5->column);
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *pfVar3 = fVar6 + *pfVar3;
      }
    }
    for (; var_2._4_4_ != r_size; var_2._4_4_ = var_2._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_2._4_4_);
      prVar5 = it + prVar4->id;
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_2._4_4_);
      bVar2 = solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
              ::rc_data::is_negative_factor(prVar4);
      if (bVar2) {
        bit_array_impl::set(&x->super_bit_array_impl,prVar5->column);
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *pfVar3 = fVar6 + *pfVar3;
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,prVar5->column);
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *pfVar3 = *pfVar3 - fVar6;
      }
    }
  }
  else {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)selected);
    auVar7 = vfmadd213ss_fma(ZEXT416((uint)(prVar4->value * 1.5)),
                             ZEXT416((uint)(kappa / (1.0 - kappa))),ZEXT416((uint)delta));
    for (var_1._4_4_ = 0; var_1._4_4_ != r_size; var_1._4_4_ = var_1._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_1._4_4_);
      prVar5 = it + prVar4->id;
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_1._4_4_);
      bVar2 = solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
              ::rc_data::is_negative_factor(prVar4);
      if (bVar2) {
        bit_array_impl::unset(&x->super_bit_array_impl,prVar5->column);
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *pfVar3 = *pfVar3 - auVar7._0_4_;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,prVar5->column);
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *pfVar3 = auVar7._0_4_ + *pfVar3;
      }
    }
  }
  bVar2 = is_valid_constraint<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
                    (slv,k,x);
  if (bVar2) {
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&slv->pi,(long)k);
    bVar2 = is_signbit_change<float>(lhs,*pfVar3);
    return bVar2;
  }
  details::fail_fast("Precondition","is_valid_constraint(slv, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                     ,"464");
}

Assistant:

bool
affect(Solver& slv,
       Xtype& x,
       Iterator it,
       int k,
       int selected,
       int r_size,
       const Float kappa,
       const Float delta)
{
    constexpr Float one{ 1 };
    constexpr Float two{ 2 };
    constexpr Float middle{ (two + one) / two };

    const auto old_pi = slv.pi[k];

    auto d = delta;

    if (selected < 0) {
        // slv.pi[k] += slv.R[0].value / two;
        d += (kappa / (one - kappa)) * (slv.R[0].value / two);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    } else if (selected + 1 >= r_size) {
        // slv.pi[k] += slv.R[selected].value * middle;
        d += (kappa / (one - kappa)) * (slv.R[selected].value * middle);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }
    } else {
        slv.pi[k] +=
          ((slv.R[selected].value + slv.R[selected + 1].value) / two);
        d += (kappa / (one - kappa)) *
             (slv.R[selected + 1].value - slv.R[selected].value);

        int i = 0;
        for (; i <= selected; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }

        for (; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    }

    // TODO job: develops is_valid_constraint for all the solvers
    bx_expects(is_valid_constraint(slv, k, x));

    return is_signbit_change(old_pi, slv.pi[k]);
}